

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O3

Abc_Ntk_t * Bbl_ManToAig(Bbl_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__ptr;
  Bbl_Obj_t *pBVar5;
  char *pcVar6;
  Dec_Graph_t *pDVar7;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *p_00;
  void **ppvVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *__ptr_00;
  Vec_Ptr_t *vFaninAigs;
  Bbl_Obj_t *pBVar10;
  Abc_Obj_t *pObj;
  long lVar11;
  ulong uVar12;
  timespec ts;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  iVar2 = Bbl_ManFncSize(p);
  __ptr = calloc((long)iVar2,8);
  for (pBVar5 = Bbl_ManObjFirst(p); pBVar5 != (Bbl_Obj_t *)0x0; pBVar5 = Bbl_ManObjNext(p,pBVar5)) {
    iVar2 = Bbl_ObjFncHandle(pBVar5);
    if (*(long *)((long)__ptr + (long)iVar2 * 8) == 0) {
      pcVar6 = Bbl_ObjSop(p,pBVar5);
      pDVar7 = Dec_Factor(pcVar6);
      iVar2 = Bbl_ObjFncHandle(pBVar5);
      *(Dec_Graph_t **)((long)__ptr + (long)iVar2 * 8) = pDVar7;
    }
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar6 = Bbl_ManName(p);
  pcVar6 = Extra_UtilStrsav(pcVar6);
  pNtk->pName = pcVar6;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  p_00->nCap = 1000;
  ppvVar8 = (void **)calloc(1,8000);
  p_00->pArray = ppvVar8;
  p_00->nSize = 1000;
  for (pBVar5 = Bbl_ManObjFirst(p); pBVar5 != (Bbl_Obj_t *)0x0; pBVar5 = Bbl_ManObjNext(p,pBVar5)) {
    iVar2 = Bbl_ObjIsInput(pBVar5);
    if (iVar2 != 0) {
      iVar2 = Bbl_ObjId(pBVar5);
      pAVar9 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      Vec_PtrSetEntry(p_00,iVar2,pAVar9);
    }
  }
  clock_gettime(3,&local_40);
  __ptr_00 = Bbl_ManDfs(p);
  vFaninAigs = (Vec_Ptr_t *)malloc(0x10);
  vFaninAigs->nCap = 100;
  vFaninAigs->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  vFaninAigs->pArray = ppvVar8;
  iVar2 = __ptr_00->nSize;
  if (0 < (long)iVar2) {
    lVar11 = 0;
    do {
      pBVar5 = (Bbl_Obj_t *)__ptr_00->pArray[lVar11];
      vFaninAigs->nSize = 0;
      for (pBVar10 = Bbl_ObjFaninFirst(pBVar5); pBVar10 != (Bbl_Obj_t *)0x0;
          pBVar10 = Bbl_ObjFaninNext(pBVar5,pBVar10)) {
        uVar3 = Bbl_ObjId(pBVar10);
        if (((int)uVar3 < 0) || (p_00->nSize <= (int)uVar3)) goto LAB_002c76ee;
        pvVar1 = p_00->pArray[uVar3];
        uVar3 = vFaninAigs->nSize;
        if (uVar3 == vFaninAigs->nCap) {
          if ((int)uVar3 < 0x10) {
            if (vFaninAigs->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(vFaninAigs->pArray,0x80);
            }
            vFaninAigs->pArray = ppvVar8;
            vFaninAigs->nCap = 0x10;
          }
          else {
            if (vFaninAigs->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(vFaninAigs->pArray,(ulong)uVar3 << 4);
            }
            vFaninAigs->pArray = ppvVar8;
            vFaninAigs->nCap = uVar3 * 2;
          }
        }
        else {
          ppvVar8 = vFaninAigs->pArray;
        }
        iVar4 = vFaninAigs->nSize;
        vFaninAigs->nSize = iVar4 + 1;
        ppvVar8[iVar4] = pvVar1;
      }
      iVar4 = Bbl_ObjFncHandle(pBVar5);
      pAVar9 = Dec_GraphToAig(pNtk,*(Dec_Graph_t **)((long)__ptr + (long)iVar4 * 8),vFaninAigs);
      iVar4 = Bbl_ObjId(pBVar5);
      Vec_PtrSetEntry(p_00,iVar4,pAVar9);
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
    ppvVar8 = vFaninAigs->pArray;
  }
  if (ppvVar8 != (void **)0x0) {
    free(ppvVar8);
  }
  free(vFaninAigs);
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  for (pBVar5 = Bbl_ManObjFirst(p); pBVar5 != (Bbl_Obj_t *)0x0; pBVar5 = Bbl_ManObjNext(p,pBVar5)) {
    iVar2 = Bbl_ObjIsOutput(pBVar5);
    if (iVar2 != 0) {
      pBVar10 = Bbl_ObjFaninFirst(pBVar5);
      uVar3 = Bbl_ObjId(pBVar10);
      if (((int)uVar3 < 0) || (p_00->nSize <= (int)uVar3)) {
LAB_002c76ee:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar9 = (Abc_Obj_t *)p_00->pArray[uVar3];
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pObj,pAVar9);
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  uVar3 = Bbl_ManFncSize(p);
  if ((int)uVar3 < 1) {
    if (__ptr == (void *)0x0) goto LAB_002c76a1;
  }
  else {
    uVar12 = (ulong)uVar3 + 1;
    do {
      pvVar1 = *(void **)((long)__ptr + uVar12 * 8 + -0x10);
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 0x10) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 0x10));
        }
        free(pvVar1);
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  free(__ptr);
LAB_002c76a1:
  clock_gettime(3,&local_40);
  if (p_00->pArray != (void **)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Bbl_ManToAig( Bbl_Man_t * p )
{
    extern int Bbl_ManFncSize( Bbl_Man_t * p );
    extern int Bbl_ObjFncHandle( Bbl_Obj_t * p );
    extern Abc_Obj_t * Dec_GraphToAig( Abc_Ntk_t * pNtk, Dec_Graph_t * pFForm, Vec_Ptr_t * vFaninAigs );
    int fVerbose = 0;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObjNew;
    Bbl_Obj_t * pObj, * pFanin;
    Vec_Ptr_t * vCopy, * vNodes, * vFaninAigs;
    Dec_Graph_t ** pFForms;
    int i;
    abctime clk;
clk = Abc_Clock();
    // map SOP handles into factored forms
    pFForms = ABC_CALLOC( Dec_Graph_t *, Bbl_ManFncSize(p) );
    Bbl_ManForEachObj( p, pObj )
        if ( pFForms[Bbl_ObjFncHandle(pObj)] == NULL )
            pFForms[Bbl_ObjFncHandle(pObj)] = Dec_Factor( Bbl_ObjSop(p, pObj) );
if ( fVerbose )
ABC_PRT( "Fct", Abc_Clock() - clk );
    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtk->pName = Extra_UtilStrsav( Bbl_ManName(p) );
    vCopy = Vec_PtrStart( 1000 );
    // create CIs
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsInput(pObj) )
            continue;
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), Abc_NtkCreatePi(pNtk) );
    }
clk = Abc_Clock();
    // create internal nodes
    vNodes = Bbl_ManDfs( p );
    vFaninAigs = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Bbl_Obj_t *, vNodes, pObj, i )
    {
        // collect fanin AIGs
        Vec_PtrClear( vFaninAigs );
        Bbl_ObjForEachFanin( pObj, pFanin )
            Vec_PtrPush( vFaninAigs, Vec_PtrEntry( vCopy, Bbl_ObjId(pFanin) ) );
        // create the new node
        pObjNew = Dec_GraphToAig( pNtk, pFForms[Bbl_ObjFncHandle(pObj)], vFaninAigs );
        Vec_PtrSetEntry( vCopy, Bbl_ObjId(pObj), pObjNew );
    }
    Vec_PtrFree( vFaninAigs );
    Vec_PtrFree( vNodes );
if ( fVerbose )
ABC_PRT( "AIG", Abc_Clock() - clk );
    // create COs
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        pObjNew = (Abc_Obj_t *)Vec_PtrEntry( vCopy, Bbl_ObjId(Bbl_ObjFaninFirst(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pObjNew );
    }
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
    // clear factored forms
    for ( i = Bbl_ManFncSize(p) - 1; i >= 0; i-- )
        if ( pFForms[i] )
            Dec_GraphFree( pFForms[i] );
    ABC_FREE( pFForms );
    // finalize
clk = Abc_Clock();
    Vec_PtrFree( vCopy );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
if ( fVerbose )
ABC_PRT( "Nam", Abc_Clock() - clk );
//    if ( !Abc_NtkCheck( pNtk ) )
//        printf( "Bbl_ManToAig(): Network check has failed.\n" );
    return pNtk;
}